

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeNaN.cpp
# Opt level: O2

void __thiscall
wasm::DeNaN::addFunc
          (DeNaN *this,Module *module,Name name,Type type,Literal *literal,
          optional<wasm::BinaryOp> op)

{
  Binary *pBVar1;
  Binary *pBVar2;
  Binary *right;
  LocalGet *right_00;
  LocalGet *pLVar3;
  Const *ifFalse;
  If *pIVar4;
  Expression *body;
  Signature sig;
  Name name_00;
  optional<wasm::Type> type_00;
  HeapType local_98;
  Literal local_90;
  undefined1 auStack_78 [8];
  anon_class_16_2_29df2df6 getLane;
  undefined1 local_60 [8];
  anon_class_16_2_b3a5d210 getLaneCheck;
  Builder local_48;
  Type type_local;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  Builder builder;
  
  sig.results.id = type.id;
  sig.params.id = type.id;
  getLaneCheck.getLane = (anon_class_16_2_29df2df6 *)literal;
  local_48.wasm = (Module *)type.id;
  func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)module;
  HeapType::HeapType(&local_98,sig);
  body = (Expression *)auStack_78;
  auStack_78 = (undefined1  [8])0x0;
  getLane.builder = (Builder *)0x0;
  getLane.type = (Type *)0x0;
  name_00.super_IString.str._M_str = name.super_IString.str._M_len;
  name_00.super_IString.str._M_len = (size_t)&type_local;
  Builder::makeFunction
            (name_00,(HeapType)name.super_IString.str._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_98.id,body);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
            ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_78);
  if (type.id == 6) {
    if (((ulong)op.super__Optional_base<wasm::BinaryOp,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::BinaryOp> >> 0x20 & 1) != 0) {
      __assert_fail("!op",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DeNaN.cpp"
                    ,0xab,
                    "void wasm::DeNaN::addFunc(Module *, Name, Type, Literal, std::optional<BinaryOp>)"
                   );
    }
    auStack_78 = (undefined1  [8])&func;
    getLane.builder = &local_48;
    local_60 = auStack_78;
    getLaneCheck.builder = (Builder *)auStack_78;
    pBVar1 = addFunc::anon_class_16_2_b3a5d210::operator()((anon_class_16_2_b3a5d210 *)local_60,0);
    pBVar2 = addFunc::anon_class_16_2_b3a5d210::operator()((anon_class_16_2_b3a5d210 *)local_60,1);
    pBVar1 = Builder::makeBinary((Builder *)&func,AndInt32,(Expression *)pBVar1,(Expression *)pBVar2
                                );
    pBVar2 = addFunc::anon_class_16_2_b3a5d210::operator()((anon_class_16_2_b3a5d210 *)local_60,2);
    right = addFunc::anon_class_16_2_b3a5d210::operator()((anon_class_16_2_b3a5d210 *)local_60,3);
    pBVar2 = Builder::makeBinary((Builder *)&func,AndInt32,(Expression *)pBVar2,(Expression *)right)
    ;
    pBVar1 = Builder::makeBinary((Builder *)&func,AndInt32,(Expression *)pBVar1,(Expression *)pBVar2
                                );
    type.id = (uintptr_t)local_48.wasm;
  }
  else {
    if (((ulong)op.super__Optional_base<wasm::BinaryOp,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::BinaryOp> >> 0x20 & 1) == 0) {
      __assert_fail("op",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DeNaN.cpp"
                    ,0xa7,
                    "void wasm::DeNaN::addFunc(Module *, Name, Type, Literal, std::optional<BinaryOp>)"
                   );
    }
    pLVar3 = MixedArena::alloc<wasm::LocalGet>(&module->allocator);
    pLVar3->index = 0;
    (pLVar3->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = type.id;
    right_00 = MixedArena::alloc<wasm::LocalGet>
                         ((MixedArena *)
                          ((long)func._M_t.
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl +
                          0x200));
    right_00->index = 0;
    (right_00->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = type.id
    ;
    pBVar1 = Builder::makeBinary((Builder *)&func,
                                 op.super__Optional_base<wasm::BinaryOp,_true,_true>._M_payload.
                                 super__Optional_payload_base<wasm::BinaryOp>._M_payload,
                                 (Expression *)pLVar3,(Expression *)right_00);
  }
  pLVar3 = MixedArena::alloc<wasm::LocalGet>
                     ((MixedArena *)
                      ((long)func._M_t.
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200));
  pLVar3->index = 0;
  (pLVar3->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = type.id;
  Literal::Literal(&local_90,(Literal *)getLaneCheck.getLane);
  ifFalse = Builder::makeConst((Builder *)&func,&local_90);
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)body;
  pIVar4 = Builder::makeIf((Builder *)&func,(Expression *)pBVar1,(Expression *)pLVar3,
                           (Expression *)ifFalse,type_00);
  *(If **)(type_local.id + 0x60) = pIVar4;
  Literal::~Literal(&local_90);
  Module::addFunction(module,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                             &type_local);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
            ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&type_local);
  return;
}

Assistant:

void addFunc(Module* module,
               Name name,
               Type type,
               Literal literal,
               std::optional<BinaryOp> op = {}) {
    Builder builder(*module);
    auto func = Builder::makeFunction(name, Signature(type, type), {});
    // Compare the value to itself to check if it is a NaN, and return 0 if
    // so:
    //
    //   (if (result f*)
    //     (f*.eq
    //       (local.get $0)
    //       (local.get $0)
    //     )
    //     (local.get $0)
    //     (f*.const 0)
    //   )
    Expression* condition;
    if (type != Type::v128) {
      // Generate a simple condition.
      assert(op);
      condition = builder.makeBinary(
        *op, builder.makeLocalGet(0, type), builder.makeLocalGet(0, type));
    } else {
      assert(!op);
      // v128 is trickier as the 128 bits may contain f32s or f64s, and we
      // need to check for nans both ways in principle. However, the f32 NaN
      // pattern is a superset of f64, since it checks less bits (8 bit
      // exponent vs 11), and it is checked in more places (4 32-bit values vs
      // 2 64-bit ones), so we can just check that. That is, this reduces to 4
      // checks of f32s, but is otherwise the same as a check of a single f32.
      //
      // However there is additional complexity, which is that if we do
      // EqVecF32x4 then we get all-1s for each case where we compare equal.
      // That itself is a NaN pattern, which means that running this pass
      // twice would interfere with itself. To avoid that we'd need a way to
      // detect our previous instrumentation and not instrument it, but that
      // is tricky (we can't depend on function names etc. while fuzzing).
      // Instead, extract the lanes and use f32 checks.
      auto getLane = [&](Index index) {
        return builder.makeSIMDExtract(
          ExtractLaneVecF32x4, builder.makeLocalGet(0, type), index);
      };
      auto getLaneCheck = [&](Index index) {
        return builder.makeBinary(EqFloat32, getLane(index), getLane(index));
      };
      auto* firstTwo =
        builder.makeBinary(AndInt32, getLaneCheck(0), getLaneCheck(1));
      auto* lastTwo =
        builder.makeBinary(AndInt32, getLaneCheck(2), getLaneCheck(3));
      condition = builder.makeBinary(AndInt32, firstTwo, lastTwo);
    }
    func->body = builder.makeIf(
      condition, builder.makeLocalGet(0, type), builder.makeConst(literal));
    module->addFunction(std::move(func));
  }